

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  const_iterator cVar2;
  Value *pVVar3;
  Value *extraout_RAX;
  socklen_t *__addr_len_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  undefined4 in_register_00000034;
  sockaddr *__addr_00;
  code *pcVar4;
  long *plVar5;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  sockaddr local_100;
  long local_f0 [25];
  
  if (accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
    __addr = extraout_RDX;
    if (iVar1 != 0) {
      memcpy(&local_100,&DAT_001ae118,0xd8);
      std::
      _Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _Hashtable<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>const*>
                ((_Hashtable<int,std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>,std::allocator<std::pair<int_const,flow::Value*(flow::lang::IRGenerator::*)(flow::Value*,std::__cxx11::string_const&)>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,&local_100,
                 &stack0xffffffffffffffd8,0,&local_101,&local_102,&local_103);
      __cxa_atexit(std::
                   unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                   ::~unordered_map,&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
      __addr = extraout_RDX_00;
    }
  }
  plVar5 = *(long **)(CONCAT44(in_register_00000034,__fd) + 0x48);
  (**(code **)(*plVar5 + 0x10))(plVar5,this,__addr);
  pVVar3 = this->result_;
  __addr_00 = &local_100;
  local_100.sa_data._0_2_ = 0;
  local_100.sa_family = *(ushort *)(CONCAT44(in_register_00000034,__fd) + 0x40);
  cVar2 = std::
          _Hashtable<int,_std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_._M_h,(key_type *)__addr_00);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
      ._M_cur != (__node_type *)0x0) {
    pcVar4 = *(code **)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                              ._M_cur + 0x10);
    plVar5 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor +
                     *(long *)((long)cVar2.
                                     super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                                     ._M_cur + 0x18));
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar5 + -1);
    }
    local_100._0_8_ = local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
    pVVar3 = (Value *)(*pcVar4)(plVar5,pVVar3,&local_100);
    this->result_ = pVVar3;
    if ((long *)local_100._0_8_ != local_f0) {
      operator_delete((void *)local_100._0_8_,local_f0[0] + 1);
      pVVar3 = extraout_RAX;
    }
    return (int)pVVar3;
  }
  iVar1 = accept(__fd + 0x40,__addr_00,__addr_len_00);
  __cxa_guard_abort(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
  _Unwind_Resume(iVar1);
}

Assistant:

void IRGenerator::accept(UnaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, const std::string&)> ops =
      {{Opcode::N2S, &IRGenerator::createN2S},
       {Opcode::P2S, &IRGenerator::createP2S},
       {Opcode::C2S, &IRGenerator::createC2S},
       {Opcode::R2S, &IRGenerator::createR2S},
       {Opcode::S2N, &IRGenerator::createS2N},
       {Opcode::NNEG, &IRGenerator::createNeg},
       {Opcode::NNOT, &IRGenerator::createNot},
       {Opcode::BNOT, &IRGenerator::createBNot},
       {Opcode::SLEN, &IRGenerator::createSLen}, };

  Value* rhs = codegen(expr.subExpr());

  auto i = ops.find(expr.op());
  FLOW_ASSERT(i != ops.end(), fmt::format("Unsupported unary expression {} in IRGenerator.", mnemonic(expr.op())));
  result_ = (this->*i->second)(rhs, "");
}